

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::Translate(ParsedScene *this,Float dx,Float dy,Float dz,FileLoc loc)

{
  Transform *pTVar1;
  long in_RDI;
  int i;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TransformSet *in_stack_fffffffffffffef8;
  FileLoc *in_stack_ffffffffffffff00;
  Transform *in_stack_ffffffffffffff48;
  Transform *in_stack_ffffffffffffff50;
  undefined1 local_98 [24];
  Vector3f *in_stack_ffffffffffffff80;
  int local_18;
  
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[10]>
              (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char (*) [10])CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  else {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      if ((*(uint *)(in_RDI + 0x964) & 1 << ((byte)local_18 & 0x1f)) != 0) {
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        Vector3<float>::Vector3
                  ((Vector3<float> *)pTVar1,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0.0)
        ;
        pbrt::Translate(in_stack_ffffffffffffff80);
        pbrt::Transform::operator*(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        pTVar1 = TransformSet::operator[](in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        memcpy(pTVar1,local_98,0x80);
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::Translate(Float dx, Float dy, Float dz, FileLoc loc) {
    VERIFY_INITIALIZED("Translate");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * pbrt::Translate(Vector3f(dx, dy, dz));)
}